

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManComputeOverlap(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x176,"int Gia_ManComputeOverlap(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  iVar2 = (p->vCos->nSize - iVar1) + p->vCis->nSize + 1;
  if (1 < iVar1) {
    lVar3 = 1;
    do {
      if (p->vMapping->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[lVar3] != 0) {
        iVar1 = Gia_ManComputeOverlapOne(p,(int)lVar3);
        iVar2 = iVar2 + iVar1;
        iVar1 = p->nObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return iVar2;
}

Assistant:

int Gia_ManComputeOverlap( Gia_Man_t * p )
{
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlapOne( p, i );
    return Count;
}